

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O1

int IDAStopTest1(IDAMem IDA_mem,sunrealtype tout,sunrealtype *tret,N_Vector yret,N_Vector ypret,
                int itask)

{
  double dVar1;
  int iVar2;
  double t;
  double dVar3;
  double dVar4;
  
  if (IDA_mem->ida_tstopset != 0) {
    dVar3 = IDA_mem->ida_tn;
    t = IDA_mem->ida_tstop;
    dVar1 = IDA_mem->ida_hh;
    if (0.0 < (dVar3 - t) * dVar1) {
      iVar2 = 0x15b1;
LAB_001154fd:
      IDAProcessError(IDA_mem,-0x16,iVar2,"IDAStopTest1",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                      ,
                      "The value tstop = %.15g is behind current t = %.15gin the direction of integration."
                      ,t,dVar3);
      return -0x16;
    }
    dVar4 = (ABS(dVar1) + ABS(dVar3)) * IDA_mem->ida_uround * 100.0;
    if (ABS(dVar3 - t) <= dVar4) {
      if ((0.0 <= dVar1 * (tout - t)) || (ABS(tout - t) <= dVar4)) {
        iVar2 = IDAGetSolution(IDA_mem,t,yret,ypret);
        t = IDA_mem->ida_tstop;
        if (iVar2 == 0) {
          IDA_mem->ida_tretlast = t;
          *tret = t;
          IDA_mem->ida_tstopset = 0;
          return 1;
        }
        dVar3 = IDA_mem->ida_tn;
        iVar2 = 0x15c3;
        goto LAB_001154fd;
      }
    }
    else if (0.0 < ((dVar3 + dVar1) - t) * dVar1) {
      IDA_mem->ida_hh = (IDA_mem->ida_uround * -4.0 + 1.0) * (t - dVar3);
    }
  }
  if (itask == 2) {
    if ((IDA_mem->ida_tn - IDA_mem->ida_tretlast) * IDA_mem->ida_hh <= 0.0) {
      return 99;
    }
    IDAGetSolution(IDA_mem,IDA_mem->ida_tn,yret,ypret);
    tout = IDA_mem->ida_tn;
  }
  else {
    if (itask != 1) {
      return -0x16;
    }
    if ((IDA_mem->ida_tretlast == tout) && (!NAN(IDA_mem->ida_tretlast) && !NAN(tout))) {
      IDA_mem->ida_tretlast = tout;
      *tret = tout;
      return 0;
    }
    if ((IDA_mem->ida_tn - tout) * IDA_mem->ida_hh < 0.0) {
      return 99;
    }
    iVar2 = IDAGetSolution(IDA_mem,tout,yret,ypret);
    if (iVar2 != 0) {
      IDAProcessError(IDA_mem,-0x16,0x15e5,"IDAStopTest1",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                      ,
                      "Trouble interpolating at tout = %.15g. tout too far back in direction of integration."
                      ,tout);
      return -0x16;
    }
  }
  IDA_mem->ida_tretlast = tout;
  *tret = tout;
  return 0;
}

Assistant:

static int IDAStopTest1(IDAMem IDA_mem, sunrealtype tout, sunrealtype* tret,
                        N_Vector yret, N_Vector ypret, int itask)
{
  int ier;
  sunrealtype troundoff;

  if (IDA_mem->ida_tstopset)
  {
    /* Test for tn past tstop */
    if ((IDA_mem->ida_tn - IDA_mem->ida_tstop) * IDA_mem->ida_hh > ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_TSTOP, IDA_mem->ida_tstop, IDA_mem->ida_tn);
      return (IDA_ILL_INPUT);
    }

    troundoff = HUNDRED * IDA_mem->ida_uround *
                (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));

    /* Test for tn at tstop */
    if (SUNRabs(IDA_mem->ida_tn - IDA_mem->ida_tstop) <= troundoff)
    {
      /* Ensure tout >= tstop, otherwise check for tout return below */
      if ((tout - IDA_mem->ida_tstop) * IDA_mem->ida_hh >= ZERO ||
          SUNRabs(tout - IDA_mem->ida_tstop) <= troundoff)
      {
        ier = IDAGetSolution(IDA_mem, IDA_mem->ida_tstop, yret, ypret);
        if (ier != IDA_SUCCESS)
        {
          IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_BAD_TSTOP, IDA_mem->ida_tstop, IDA_mem->ida_tn);
          return (IDA_ILL_INPUT);
        }
        *tret = IDA_mem->ida_tretlast = IDA_mem->ida_tstop;
        IDA_mem->ida_tstopset         = SUNFALSE;
        return (IDA_TSTOP_RETURN);
      }
    }
    /* Test for tn approaching tstop */
    else if ((IDA_mem->ida_tn + IDA_mem->ida_hh - IDA_mem->ida_tstop) *
               IDA_mem->ida_hh >
             ZERO)
    {
      IDA_mem->ida_hh = (IDA_mem->ida_tstop - IDA_mem->ida_tn) *
                        (ONE - FOUR * IDA_mem->ida_uround);
    }
  }

  switch (itask)
  {
  case IDA_NORMAL:

    /* Test for tout = tretlast, and for tn past tout. */
    if (tout == IDA_mem->ida_tretlast)
    {
      *tret = IDA_mem->ida_tretlast = tout;
      return (IDA_SUCCESS);
    }
    if ((IDA_mem->ida_tn - tout) * IDA_mem->ida_hh >= ZERO)
    {
      ier = IDAGetSolution(IDA_mem, tout, yret, ypret);
      if (ier != IDA_SUCCESS)
      {
        IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_BAD_TOUT, tout);
        return (IDA_ILL_INPUT);
      }
      *tret = IDA_mem->ida_tretlast = tout;
      return (IDA_SUCCESS);
    }

    return (CONTINUE_STEPS);

  case IDA_ONE_STEP:

    /* Test for tn past tretlast. */
    if ((IDA_mem->ida_tn - IDA_mem->ida_tretlast) * IDA_mem->ida_hh > ZERO)
    {
      ier   = IDAGetSolution(IDA_mem, IDA_mem->ida_tn, yret, ypret);
      *tret = IDA_mem->ida_tretlast = IDA_mem->ida_tn;
      return (IDA_SUCCESS);
    }

    return (CONTINUE_STEPS);
  }
  return (IDA_ILL_INPUT); /* This return should never happen. */
}